

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cc
# Opt level: O2

void __thiscall t_client_wrapper::f_on_message(t_client_wrapper *this,wstring_view a_message)

{
  t_object *a_key;
  __pointer_type ptVar1;
  size_t *a_index;
  atomic<xemmai::t_object_*> local_28;
  t_type_of<xemmai::t_object> *local_20;
  
  local_20 = (t_type_of<xemmai::t_object> *)a_message._M_str;
  local_28._M_b._M_p = (__base_type)a_message._M_len;
  a_key = this->v_self;
  ptVar1 = (a_key->v_type->v_module).v_p._M_b._M_p;
  a_index = *(size_t **)(ptVar1->v_data + 0x10);
  t_callback_library::f_as<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>&>
            ((t_callback_library *)&stack0xffffffffffffffc8,
             (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)ptVar1->v_data);
  xemmai::t_object::f_invoke<xemmai::t_value<xemmai::t_pointer>>
            ((t_object *)&stack0xffffffffffffffb8,a_key,a_index,
             (t_value<xemmai::t_pointer> *)&f_on_message::index);
  return;
}

Assistant:

virtual void f_on_message(std::wstring_view a_message)
	{
		auto& library = v_self->f_type()->v_module->f_as<t_callback_library>();
		static size_t index;
		v_self->f_invoke(library.v_symbol_on_message, index, library.f_as(a_message));
	}